

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::ModeState<int,duckdb::ModeStandard<int>>,int,duckdb::ModeFunction<duckdb::ModeStandard<int>>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  ulong uVar4;
  ulong uVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar2 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      uVar4 = 0;
      uVar7 = 0;
      do {
        puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar5 = 0xffffffffffffffff;
        }
        else {
          uVar5 = puVar1[uVar4];
        }
        uVar8 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar8 = count;
        }
        uVar9 = uVar8;
        if (uVar5 != 0) {
          uVar9 = uVar7;
          if (uVar5 == 0xffffffffffffffff) {
            if (uVar7 < uVar8) {
              piVar6 = (int *)(pdVar2 + uVar7 * 4);
              do {
                BaseModeFunction<duckdb::ModeStandard<int>>::
                Execute<int,duckdb::ModeState<int,duckdb::ModeStandard<int>>,duckdb::ModeFunction<duckdb::ModeStandard<int>>>
                          ((ModeState<int,_duckdb::ModeStandard<int>_> *)state,piVar6,
                           aggr_input_data);
                uVar7 = uVar7 + 1;
                piVar6 = piVar6 + 1;
                uVar9 = uVar7;
              } while (uVar8 != uVar7);
            }
          }
          else if (uVar7 < uVar8) {
            piVar6 = (int *)(pdVar2 + uVar7 * 4);
            uVar9 = 0;
            do {
              if ((uVar5 >> (uVar9 & 0x3f) & 1) != 0) {
                BaseModeFunction<duckdb::ModeStandard<int>>::
                Execute<int,duckdb::ModeState<int,duckdb::ModeStandard<int>>,duckdb::ModeFunction<duckdb::ModeStandard<int>>>
                          ((ModeState<int,_duckdb::ModeStandard<int>_> *)state,piVar6,
                           aggr_input_data);
              }
              uVar9 = uVar9 + 1;
              piVar6 = piVar6 + 1;
            } while ((uVar7 - uVar8) + uVar9 != 0);
            uVar9 = uVar7 + uVar9;
          }
        }
        uVar4 = uVar4 + 1;
        uVar7 = uVar9;
      } while (uVar4 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      local_78.data = (data_ptr_t)&input->validity;
      local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      local_78.sel = (SelectionVector *)aggr_input_data;
      TypedModeFunction<duckdb::ModeStandard<int>>::
      ConstantOperation<int,duckdb::ModeState<int,duckdb::ModeStandard<int>>,duckdb::ModeFunction<duckdb::ModeStandard<int>>>
                ((ModeState<int,_duckdb::ModeStandard<int>_> *)state,(int *)input->data,
                 (AggregateUnaryInput *)&local_78,count);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar3 = (local_78.sel)->sel_vector;
        uVar7 = 0;
        do {
          uVar4 = uVar7;
          if (psVar3 != (sel_t *)0x0) {
            uVar4 = (ulong)psVar3[uVar7];
          }
          BaseModeFunction<duckdb::ModeStandard<int>>::
          Execute<int,duckdb::ModeState<int,duckdb::ModeStandard<int>>,duckdb::ModeFunction<duckdb::ModeStandard<int>>>
                    ((ModeState<int,_duckdb::ModeStandard<int>_> *)state,
                     (int *)(local_78.data + uVar4 * 4),aggr_input_data);
          uVar7 = uVar7 + 1;
        } while (count != uVar7);
      }
    }
    else if (count != 0) {
      psVar3 = (local_78.sel)->sel_vector;
      uVar7 = 0;
      do {
        uVar4 = uVar7;
        if (psVar3 != (sel_t *)0x0) {
          uVar4 = (ulong)psVar3[uVar7];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar4 >> 6]
             >> (uVar4 & 0x3f) & 1) != 0)) {
          BaseModeFunction<duckdb::ModeStandard<int>>::
          Execute<int,duckdb::ModeState<int,duckdb::ModeStandard<int>>,duckdb::ModeFunction<duckdb::ModeStandard<int>>>
                    ((ModeState<int,_duckdb::ModeStandard<int>_> *)state,
                     (int *)(local_78.data + uVar4 * 4),aggr_input_data);
        }
        uVar7 = uVar7 + 1;
      } while (count != uVar7);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}